

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  Scene *pSVar3;
  Ref<embree::Geometry> *pRVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 (*pauVar29) [16];
  int iVar30;
  uint uVar31;
  undefined1 (*pauVar32) [16];
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  Geometry *pGVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  float fVar134;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [16];
  float fVar139;
  undefined1 auVar136 [32];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar141 [32];
  float fVar145;
  undefined4 uVar146;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar156;
  float fVar160;
  float fVar161;
  undefined1 auVar157 [16];
  float fVar162;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar163;
  float fVar166;
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1550 [16];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  undefined4 uStack_14e4;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  float local_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float local_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float local_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar84 [32];
  
  pauVar32 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar146 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1370._4_4_ = uVar146;
  local_1370._0_4_ = uVar146;
  local_1370._8_4_ = uVar146;
  local_1370._12_4_ = uVar146;
  auVar118 = ZEXT1664(local_1370);
  uVar146 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1380._4_4_ = uVar146;
  local_1380._0_4_ = uVar146;
  local_1380._8_4_ = uVar146;
  local_1380._12_4_ = uVar146;
  auVar123 = ZEXT1664(local_1380);
  uVar146 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1390._4_4_ = uVar146;
  local_1390._0_4_ = uVar146;
  local_1390._8_4_ = uVar146;
  local_1390._12_4_ = uVar146;
  auVar133 = ZEXT1664(local_1390);
  fStack_13c4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_13d4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_13e4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fStack_1394 = fStack_13c4 * 0.99999964;
  fStack_13a4 = fStack_13d4 * 0.99999964;
  fStack_13b4 = fStack_13e4 * 0.99999964;
  fStack_13c4 = fStack_13c4 * 1.0000004;
  fStack_13d4 = fStack_13d4 * 1.0000004;
  fStack_13e4 = fStack_13e4 * 1.0000004;
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar30 = (tray->tnear).field_0.i[k];
  local_1550._4_4_ = iVar30;
  local_1550._0_4_ = iVar30;
  local_1550._8_4_ = iVar30;
  local_1550._12_4_ = iVar30;
  auVar115 = ZEXT1664(local_1550);
  iVar30 = (tray->tfar).field_0.i[k];
  auVar62 = ZEXT1664(CONCAT412(iVar30,CONCAT48(iVar30,CONCAT44(iVar30,iVar30))));
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar30 = 1 << ((uint)k & 0x1f);
  auVar66._4_4_ = iVar30;
  auVar66._0_4_ = iVar30;
  auVar66._8_4_ = iVar30;
  auVar66._12_4_ = iVar30;
  auVar66._16_4_ = iVar30;
  auVar66._20_4_ = iVar30;
  auVar66._24_4_ = iVar30;
  auVar66._28_4_ = iVar30;
  auVar67 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar66 = vpand_avx2(auVar66,auVar67);
  local_1140 = vpcmpeqd_avx2(auVar66,auVar67);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = 0x3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar72._16_4_ = 0x3f800000;
  auVar72._20_4_ = 0x3f800000;
  auVar72._24_4_ = 0x3f800000;
  auVar72._28_4_ = 0x3f800000;
  auVar67._8_4_ = 0xbf800000;
  auVar67._0_8_ = 0xbf800000bf800000;
  auVar67._12_4_ = 0xbf800000;
  auVar67._16_4_ = 0xbf800000;
  auVar67._20_4_ = 0xbf800000;
  auVar67._24_4_ = 0xbf800000;
  auVar67._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar72,auVar67,local_1100);
  fStack_1398 = fStack_1394;
  fStack_139c = fStack_1394;
  local_13a0 = fStack_1394;
  fStack_13a8 = fStack_13a4;
  fStack_13ac = fStack_13a4;
  local_13b0 = fStack_13a4;
  fStack_13b8 = fStack_13b4;
  fStack_13bc = fStack_13b4;
  local_13c0 = fStack_13b4;
  fStack_13c8 = fStack_13c4;
  fStack_13cc = fStack_13c4;
  local_13d0 = fStack_13c4;
  fStack_13d8 = fStack_13d4;
  fStack_13dc = fStack_13d4;
  local_13e0 = fStack_13d4;
  fStack_13e8 = fStack_13e4;
  fStack_13ec = fStack_13e4;
  local_13f0 = fStack_13e4;
  fVar124 = fStack_13e4;
  fVar119 = fStack_13e4;
  fVar166 = fStack_13e4;
  fVar163 = fStack_13e4;
  fVar162 = fStack_13d4;
  fVar161 = fStack_13d4;
  fVar160 = fStack_13d4;
  fVar156 = fStack_13d4;
  fVar152 = fStack_13c4;
  fVar111 = fStack_13c4;
  fVar110 = fStack_13c4;
  fVar109 = fStack_13c4;
  fVar108 = fStack_13b4;
  fVar107 = fStack_13b4;
  fVar106 = fStack_13b4;
  fVar100 = fStack_13b4;
  fVar144 = fStack_13a4;
  fVar143 = fStack_13a4;
  fVar142 = fStack_13a4;
  fVar140 = fStack_13a4;
  fVar139 = fStack_1394;
  fVar138 = fStack_1394;
  fVar137 = fStack_1394;
  fVar134 = fStack_1394;
LAB_00585d75:
  do {
    pauVar29 = pauVar32 + -1;
    pauVar32 = pauVar32 + -1;
    if (*(float *)(*pauVar29 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar40 = *(ulong *)*pauVar32;
      while ((uVar40 & 8) == 0) {
        uVar35 = uVar40 & 0xfffffffffffffff0;
        uVar146 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar63._4_4_ = uVar146;
        auVar63._0_4_ = uVar146;
        auVar63._8_4_ = uVar146;
        auVar63._12_4_ = uVar146;
        auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x80 + uVar47),auVar63,
                                  *(undefined1 (*) [16])(uVar35 + 0x20 + uVar47));
        auVar64 = vsubps_avx(auVar64,auVar118._0_16_);
        auVar75._0_4_ = fVar134 * auVar64._0_4_;
        auVar75._4_4_ = fVar137 * auVar64._4_4_;
        auVar75._8_4_ = fVar138 * auVar64._8_4_;
        auVar75._12_4_ = fVar139 * auVar64._12_4_;
        auVar64 = vmaxps_avx(auVar115._0_16_,auVar75);
        auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x80 + uVar57),auVar63,
                                  *(undefined1 (*) [16])(uVar35 + 0x20 + uVar57));
        auVar75 = vsubps_avx(auVar75,auVar123._0_16_);
        auVar85._0_4_ = fVar140 * auVar75._0_4_;
        auVar85._4_4_ = fVar142 * auVar75._4_4_;
        auVar85._8_4_ = fVar143 * auVar75._8_4_;
        auVar85._12_4_ = fVar144 * auVar75._12_4_;
        auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x80 + uVar56),auVar63,
                                  *(undefined1 (*) [16])(uVar35 + 0x20 + uVar56));
        auVar75 = vsubps_avx(auVar75,auVar133._0_16_);
        auVar92._0_4_ = fVar100 * auVar75._0_4_;
        auVar92._4_4_ = fVar106 * auVar75._4_4_;
        auVar92._8_4_ = fVar107 * auVar75._8_4_;
        auVar92._12_4_ = fVar108 * auVar75._12_4_;
        auVar75 = vmaxps_avx(auVar85,auVar92);
        local_1300 = vmaxps_avx(auVar64,auVar75);
        auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x80 + (uVar47 ^ 0x10)),auVar63,
                                  *(undefined1 (*) [16])(uVar35 + 0x20 + (uVar47 ^ 0x10)));
        auVar64 = vsubps_avx(auVar64,auVar118._0_16_);
        auVar86._0_4_ = fVar109 * auVar64._0_4_;
        auVar86._4_4_ = fVar110 * auVar64._4_4_;
        auVar86._8_4_ = fVar111 * auVar64._8_4_;
        auVar86._12_4_ = fVar152 * auVar64._12_4_;
        auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x80 + (uVar57 ^ 0x10)),auVar63,
                                  *(undefined1 (*) [16])(uVar35 + 0x20 + (uVar57 ^ 0x10)));
        auVar64 = vsubps_avx(auVar64,auVar123._0_16_);
        auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar35 + 0x80 + (uVar56 ^ 0x10)),auVar63,
                                  *(undefined1 (*) [16])(uVar35 + 0x20 + (uVar56 ^ 0x10)));
        auVar93._0_4_ = fVar156 * auVar64._0_4_;
        auVar93._4_4_ = fVar160 * auVar64._4_4_;
        auVar93._8_4_ = fVar161 * auVar64._8_4_;
        auVar93._12_4_ = fVar162 * auVar64._12_4_;
        auVar64 = vsubps_avx(auVar75,auVar133._0_16_);
        auVar101._0_4_ = fVar163 * auVar64._0_4_;
        auVar101._4_4_ = fVar166 * auVar64._4_4_;
        auVar101._8_4_ = fVar119 * auVar64._8_4_;
        auVar101._12_4_ = fVar124 * auVar64._12_4_;
        auVar64 = vminps_avx(auVar93,auVar101);
        auVar75 = vminps_avx(auVar62._0_16_,auVar86);
        auVar64 = vminps_avx(auVar75,auVar64);
        if (((uint)uVar40 & 7) == 6) {
          auVar75 = vcmpps_avx(local_1300,auVar64,2);
          auVar64 = vcmpps_avx(*(undefined1 (*) [16])(uVar35 + 0xe0),auVar63,2);
          auVar63 = vcmpps_avx(auVar63,*(undefined1 (*) [16])(uVar35 + 0xf0),1);
          auVar64 = vandps_avx(auVar64,auVar63);
          auVar64 = vandps_avx(auVar64,auVar75);
        }
        else {
          auVar64 = vcmpps_avx(local_1300,auVar64,2);
        }
        auVar64 = vpslld_avx(auVar64,0x1f);
        uVar38 = vmovmskps_avx(auVar64);
        if (uVar38 == 0) {
          if (pauVar32 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_00585d75;
        }
        uVar38 = uVar38 & 0xff;
        lVar34 = 0;
        for (uVar40 = (ulong)uVar38; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar40 = *(ulong *)(uVar35 + lVar34 * 8);
        uVar38 = uVar38 - 1 & uVar38;
        uVar39 = (ulong)uVar38;
        if (uVar38 != 0) {
          uVar31 = *(uint *)(local_1300 + lVar34 * 4);
          lVar34 = 0;
          for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar38 = uVar38 - 1 & uVar38;
          uVar37 = (ulong)uVar38;
          uVar39 = *(ulong *)(uVar35 + lVar34 * 8);
          uVar2 = *(uint *)(local_1300 + lVar34 * 4);
          if (uVar38 == 0) {
            if (uVar31 < uVar2) {
              *(ulong *)*pauVar32 = uVar39;
              *(uint *)(*pauVar32 + 8) = uVar2;
              pauVar32 = pauVar32 + 1;
            }
            else {
              *(ulong *)*pauVar32 = uVar40;
              *(uint *)(*pauVar32 + 8) = uVar31;
              pauVar32 = pauVar32 + 1;
              uVar40 = uVar39;
            }
          }
          else {
            auVar64._8_8_ = 0;
            auVar64._0_8_ = uVar40;
            auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar31));
            auVar76._8_8_ = 0;
            auVar76._0_8_ = uVar39;
            auVar75 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar2));
            lVar34 = 0;
            for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            uVar38 = uVar38 - 1 & uVar38;
            uVar40 = (ulong)uVar38;
            auVar87._8_8_ = 0;
            auVar87._0_8_ = *(ulong *)(uVar35 + lVar34 * 8);
            auVar85 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_1300 + lVar34 * 4)));
            auVar63 = vpcmpgtd_avx(auVar75,auVar64);
            if (uVar38 == 0) {
              auVar86 = vpshufd_avx(auVar63,0xaa);
              auVar63 = vblendvps_avx(auVar75,auVar64,auVar86);
              auVar64 = vblendvps_avx(auVar64,auVar75,auVar86);
              auVar75 = vpcmpgtd_avx(auVar85,auVar63);
              auVar86 = vpshufd_avx(auVar75,0xaa);
              auVar75 = vblendvps_avx(auVar85,auVar63,auVar86);
              auVar63 = vblendvps_avx(auVar63,auVar85,auVar86);
              auVar85 = vpcmpgtd_avx(auVar63,auVar64);
              auVar86 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar63,auVar64,auVar86);
              auVar64 = vblendvps_avx(auVar64,auVar63,auVar86);
              *pauVar32 = auVar64;
              pauVar32[1] = auVar85;
              uVar40 = auVar75._0_8_;
              pauVar32 = pauVar32 + 2;
            }
            else {
              lVar34 = 0;
              for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                lVar34 = lVar34 + 1;
              }
              auVar102._8_8_ = 0;
              auVar102._0_8_ = *(ulong *)(uVar35 + lVar34 * 8);
              auVar92 = vpunpcklqdq_avx(auVar102,ZEXT416(*(uint *)(local_1300 + lVar34 * 4)));
              auVar86 = vpshufd_avx(auVar63,0xaa);
              auVar63 = vblendvps_avx(auVar75,auVar64,auVar86);
              auVar64 = vblendvps_avx(auVar64,auVar75,auVar86);
              auVar75 = vpcmpgtd_avx(auVar92,auVar85);
              auVar86 = vpshufd_avx(auVar75,0xaa);
              auVar75 = vblendvps_avx(auVar92,auVar85,auVar86);
              auVar85 = vblendvps_avx(auVar85,auVar92,auVar86);
              auVar86 = vpcmpgtd_avx(auVar85,auVar64);
              auVar92 = vpshufd_avx(auVar86,0xaa);
              auVar86 = vblendvps_avx(auVar85,auVar64,auVar92);
              auVar64 = vblendvps_avx(auVar64,auVar85,auVar92);
              auVar85 = vpcmpgtd_avx(auVar75,auVar63);
              auVar92 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar75,auVar63,auVar92);
              auVar75 = vblendvps_avx(auVar63,auVar75,auVar92);
              auVar63 = vpcmpgtd_avx(auVar86,auVar75);
              auVar92 = vpshufd_avx(auVar63,0xaa);
              auVar63 = vblendvps_avx(auVar86,auVar75,auVar92);
              auVar75 = vblendvps_avx(auVar75,auVar86,auVar92);
              *pauVar32 = auVar64;
              pauVar32[1] = auVar75;
              pauVar32[2] = auVar63;
              auVar115 = ZEXT1664(local_1550);
              uVar40 = auVar85._0_8_;
              pauVar32 = pauVar32 + 3;
            }
          }
        }
      }
      uVar35 = (ulong)((uint)uVar40 & 0xf);
      if (uVar35 != 8) {
        uVar40 = uVar40 & 0xfffffffffffffff0;
        lVar34 = 0;
        do {
          lVar33 = lVar34 * 0x60;
          pSVar3 = context->scene;
          pRVar4 = (pSVar3->geometries).items;
          pGVar48 = pRVar4[*(uint *)(uVar40 + 0x40 + lVar33)].ptr;
          fVar134 = (pGVar48->time_range).lower;
          fVar134 = pGVar48->fnumTimeSegments *
                    ((*(float *)(ray + k * 4 + 0xe0) - fVar134) /
                    ((pGVar48->time_range).upper - fVar134));
          auVar64 = vroundss_avx(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134),9);
          auVar64 = vminss_avx(auVar64,ZEXT416((uint)(pGVar48->fnumTimeSegments + -1.0)));
          auVar77 = vmaxss_avx(ZEXT816(0) << 0x20,auVar64);
          iVar30 = (int)auVar77._0_4_;
          lVar49 = (long)iVar30 * 0x38;
          lVar5 = *(long *)(*(long *)&pGVar48[2].numPrimitives + lVar49);
          uVar38 = *(uint *)(uVar40 + 4 + lVar33);
          auVar64 = *(undefined1 (*) [16])(lVar5 + (ulong)*(uint *)(uVar40 + lVar33) * 4);
          uVar37 = (ulong)*(uint *)(uVar40 + 0x10 + lVar33);
          auVar75 = *(undefined1 (*) [16])(lVar5 + uVar37 * 4);
          uVar41 = (ulong)*(uint *)(uVar40 + 0x20 + lVar33);
          auVar63 = *(undefined1 (*) [16])(lVar5 + uVar41 * 4);
          uVar42 = (ulong)*(uint *)(uVar40 + 0x30 + lVar33);
          auVar85 = *(undefined1 (*) [16])(lVar5 + uVar42 * 4);
          lVar5 = *(long *)&pRVar4[*(uint *)(uVar40 + 0x44 + lVar33)].ptr[2].numPrimitives;
          lVar6 = *(long *)(lVar5 + lVar49);
          auVar86 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar38 * 4);
          uVar43 = (ulong)*(uint *)(uVar40 + 0x14 + lVar33);
          auVar92 = *(undefined1 (*) [16])(lVar6 + uVar43 * 4);
          uVar44 = (ulong)*(uint *)(uVar40 + 0x24 + lVar33);
          auVar93 = *(undefined1 (*) [16])(lVar6 + uVar44 * 4);
          uVar45 = (ulong)*(uint *)(uVar40 + 0x34 + lVar33);
          auVar101 = *(undefined1 (*) [16])(lVar6 + uVar45 * 4);
          lVar6 = *(long *)&pRVar4[*(uint *)(uVar40 + 0x48 + lVar33)].ptr[2].numPrimitives;
          lVar7 = *(long *)(lVar6 + lVar49);
          uVar46 = (ulong)*(uint *)(uVar40 + 8 + lVar33);
          auVar76 = *(undefined1 (*) [16])(lVar7 + uVar46 * 4);
          uVar52 = (ulong)*(uint *)(uVar40 + 0x18 + lVar33);
          auVar87 = *(undefined1 (*) [16])(lVar7 + uVar52 * 4);
          uVar53 = (ulong)*(uint *)(uVar40 + 0x28 + lVar33);
          auVar102 = *(undefined1 (*) [16])(lVar7 + uVar53 * 4);
          uVar54 = (ulong)*(uint *)(uVar40 + 0x38 + lVar33);
          auVar78 = *(undefined1 (*) [16])(lVar7 + uVar54 * 4);
          fVar134 = fVar134 - auVar77._0_4_;
          lVar7 = *(long *)&pRVar4[*(uint *)(uVar40 + 0x4c + lVar33)].ptr[2].numPrimitives;
          lVar49 = *(long *)(lVar7 + lVar49);
          uVar39 = (ulong)*(uint *)(uVar40 + 0xc + lVar33);
          auVar77 = *(undefined1 (*) [16])(lVar49 + uVar39 * 4);
          uVar50 = (ulong)*(uint *)(uVar40 + 0x1c + lVar33);
          auVar58 = *(undefined1 (*) [16])(lVar49 + uVar50 * 4);
          auVar116 = vunpcklps_avx(auVar64,auVar76);
          auVar76 = vunpckhps_avx(auVar64,auVar76);
          auVar120 = vunpcklps_avx(auVar86,auVar77);
          auVar86 = vunpckhps_avx(auVar86,auVar77);
          uVar51 = (ulong)*(uint *)(uVar40 + 0x2c + lVar33);
          auVar64 = *(undefined1 (*) [16])(lVar49 + uVar51 * 4);
          auVar77 = vunpcklps_avx(auVar76,auVar86);
          local_1330 = vunpcklps_avx(auVar116,auVar120);
          auVar86 = vunpckhps_avx(auVar116,auVar120);
          auVar116 = vunpcklps_avx(auVar75,auVar87);
          auVar76 = vunpckhps_avx(auVar75,auVar87);
          auVar87 = vunpcklps_avx(auVar92,auVar58);
          auVar92 = vunpckhps_avx(auVar92,auVar58);
          uVar55 = (ulong)*(uint *)(uVar40 + 0x3c + lVar33);
          auVar75 = *(undefined1 (*) [16])(lVar49 + uVar55 * 4);
          auVar76 = vunpcklps_avx(auVar76,auVar92);
          auVar58 = vunpcklps_avx(auVar116,auVar87);
          auVar92 = vunpckhps_avx(auVar116,auVar87);
          auVar87 = vunpcklps_avx(auVar63,auVar102);
          auVar63 = vunpckhps_avx(auVar63,auVar102);
          auVar102 = vunpcklps_avx(auVar93,auVar64);
          auVar93 = vunpckhps_avx(auVar93,auVar64);
          lVar36 = (long)(iVar30 + 1) * 0x38;
          lVar49 = *(long *)(*(long *)&pGVar48[2].numPrimitives + lVar36);
          auVar64 = *(undefined1 (*) [16])(lVar49 + (ulong)*(uint *)(uVar40 + lVar33) * 4);
          auVar116 = vunpcklps_avx(auVar63,auVar93);
          auVar120 = vunpcklps_avx(auVar87,auVar102);
          local_1360 = vunpckhps_avx(auVar87,auVar102);
          auVar93 = vunpcklps_avx(auVar85,auVar78);
          auVar63 = vunpckhps_avx(auVar85,auVar78);
          auVar87 = vunpcklps_avx(auVar101,auVar75);
          auVar85 = vunpckhps_avx(auVar101,auVar75);
          lVar6 = *(long *)(lVar6 + lVar36);
          auVar75 = *(undefined1 (*) [16])(lVar6 + uVar46 * 4);
          auVar102 = vunpcklps_avx(auVar63,auVar85);
          local_1340 = vunpcklps_avx(auVar93,auVar87);
          local_1350 = vunpckhps_avx(auVar93,auVar87);
          lVar5 = *(long *)(lVar5 + lVar36);
          auVar85 = vunpcklps_avx(auVar64,auVar75);
          auVar63 = vunpckhps_avx(auVar64,auVar75);
          auVar64 = *(undefined1 (*) [16])(lVar5 + (ulong)uVar38 * 4);
          lVar7 = *(long *)(lVar7 + lVar36);
          auVar75 = *(undefined1 (*) [16])(lVar7 + uVar39 * 4);
          auVar93 = vunpcklps_avx(auVar64,auVar75);
          auVar64 = vunpckhps_avx(auVar64,auVar75);
          auVar87 = vunpcklps_avx(auVar63,auVar64);
          auVar78 = vunpcklps_avx(auVar85,auVar93);
          auVar63 = vunpckhps_avx(auVar85,auVar93);
          auVar64 = *(undefined1 (*) [16])(lVar49 + uVar37 * 4);
          auVar75 = *(undefined1 (*) [16])(lVar6 + uVar52 * 4);
          auVar93 = vunpcklps_avx(auVar64,auVar75);
          auVar85 = vunpckhps_avx(auVar64,auVar75);
          auVar64 = *(undefined1 (*) [16])(lVar5 + uVar43 * 4);
          auVar75 = *(undefined1 (*) [16])(lVar7 + uVar50 * 4);
          auVar101 = vunpcklps_avx(auVar64,auVar75);
          auVar64 = vunpckhps_avx(auVar64,auVar75);
          auVar88 = vunpcklps_avx(auVar85,auVar64);
          auVar103 = vunpcklps_avx(auVar93,auVar101);
          auVar85 = vunpckhps_avx(auVar93,auVar101);
          auVar64 = *(undefined1 (*) [16])(lVar49 + uVar41 * 4);
          auVar75 = *(undefined1 (*) [16])(lVar6 + uVar53 * 4);
          auVar101 = vunpcklps_avx(auVar64,auVar75);
          auVar93 = vunpckhps_avx(auVar64,auVar75);
          auVar64 = *(undefined1 (*) [16])(lVar5 + uVar44 * 4);
          auVar75 = *(undefined1 (*) [16])(lVar7 + uVar51 * 4);
          auVar65 = vunpcklps_avx(auVar64,auVar75);
          auVar64 = vunpckhps_avx(auVar64,auVar75);
          auVar12 = vunpcklps_avx(auVar93,auVar64);
          auVar130 = vunpcklps_avx(auVar101,auVar65);
          auVar93 = vunpckhps_avx(auVar101,auVar65);
          auVar64 = *(undefined1 (*) [16])(lVar49 + uVar42 * 4);
          auVar75 = *(undefined1 (*) [16])(lVar6 + uVar54 * 4);
          auVar65 = vunpcklps_avx(auVar64,auVar75);
          auVar101 = vunpckhps_avx(auVar64,auVar75);
          auVar64 = *(undefined1 (*) [16])(lVar5 + uVar45 * 4);
          auVar75 = *(undefined1 (*) [16])(lVar7 + uVar55 * 4);
          auVar94 = vunpcklps_avx(auVar64,auVar75);
          auVar64 = vunpckhps_avx(auVar64,auVar75);
          auVar75 = vunpcklps_avx(auVar101,auVar64);
          auVar101 = vunpcklps_avx(auVar65,auVar94);
          auVar64 = vunpckhps_avx(auVar65,auVar94);
          fVar137 = 1.0 - fVar134;
          auVar157._4_4_ = fVar137;
          auVar157._0_4_ = fVar137;
          auVar157._8_4_ = fVar137;
          auVar157._12_4_ = fVar137;
          auVar65._0_4_ = fVar134 * auVar78._0_4_;
          auVar65._4_4_ = fVar134 * auVar78._4_4_;
          auVar65._8_4_ = fVar134 * auVar78._8_4_;
          auVar65._12_4_ = fVar134 * auVar78._12_4_;
          auVar78 = vfmadd231ps_fma(auVar65,auVar157,local_1330);
          auVar112._0_4_ = fVar134 * auVar63._0_4_;
          auVar112._4_4_ = fVar134 * auVar63._4_4_;
          auVar112._8_4_ = fVar134 * auVar63._8_4_;
          auVar112._12_4_ = fVar134 * auVar63._12_4_;
          auVar63 = vfmadd231ps_fma(auVar112,auVar157,auVar86);
          auVar94._0_4_ = auVar87._0_4_ * fVar134;
          auVar94._4_4_ = auVar87._4_4_ * fVar134;
          auVar94._8_4_ = auVar87._8_4_ * fVar134;
          auVar94._12_4_ = auVar87._12_4_ * fVar134;
          auVar86 = vfmadd231ps_fma(auVar94,auVar157,auVar77);
          auVar164._0_4_ = fVar134 * auVar103._0_4_;
          auVar164._4_4_ = fVar134 * auVar103._4_4_;
          auVar164._8_4_ = fVar134 * auVar103._8_4_;
          auVar164._12_4_ = fVar134 * auVar103._12_4_;
          auVar87 = vfmadd231ps_fma(auVar164,auVar157,auVar58);
          auVar103._0_4_ = fVar134 * auVar85._0_4_;
          auVar103._4_4_ = fVar134 * auVar85._4_4_;
          auVar103._8_4_ = fVar134 * auVar85._8_4_;
          auVar103._12_4_ = fVar134 * auVar85._12_4_;
          auVar85 = vfmadd231ps_fma(auVar103,auVar157,auVar92);
          auVar77._0_4_ = auVar88._0_4_ * fVar134;
          auVar77._4_4_ = auVar88._4_4_ * fVar134;
          auVar77._8_4_ = auVar88._8_4_ * fVar134;
          auVar77._12_4_ = auVar88._12_4_ * fVar134;
          auVar92 = vfmadd231ps_fma(auVar77,auVar157,auVar76);
          auVar88._0_4_ = fVar134 * auVar130._0_4_;
          auVar88._4_4_ = fVar134 * auVar130._4_4_;
          auVar88._8_4_ = fVar134 * auVar130._8_4_;
          auVar88._12_4_ = fVar134 * auVar130._12_4_;
          auVar76 = vfmadd231ps_fma(auVar88,auVar157,auVar120);
          auVar130._0_4_ = auVar93._0_4_ * fVar134;
          auVar130._4_4_ = auVar93._4_4_ * fVar134;
          auVar130._8_4_ = auVar93._8_4_ * fVar134;
          auVar130._12_4_ = auVar93._12_4_ * fVar134;
          auVar93 = vfmadd231ps_fma(auVar130,auVar157,local_1360);
          auVar135._0_4_ = auVar12._0_4_ * fVar134;
          auVar135._4_4_ = auVar12._4_4_ * fVar134;
          auVar135._8_4_ = auVar12._8_4_ * fVar134;
          auVar135._12_4_ = auVar12._12_4_ * fVar134;
          auVar77 = vfmadd231ps_fma(auVar135,auVar157,auVar116);
          auVar116._0_4_ = fVar134 * auVar101._0_4_;
          auVar116._4_4_ = fVar134 * auVar101._4_4_;
          auVar116._8_4_ = fVar134 * auVar101._8_4_;
          auVar116._12_4_ = fVar134 * auVar101._12_4_;
          auVar120._0_4_ = auVar64._0_4_ * fVar134;
          auVar120._4_4_ = auVar64._4_4_ * fVar134;
          auVar120._8_4_ = auVar64._8_4_ * fVar134;
          auVar120._12_4_ = auVar64._12_4_ * fVar134;
          lVar5 = uVar40 + 0x40 + lVar33;
          local_10e0 = *(undefined8 *)(lVar5 + 0x10);
          uStack_10d8 = *(undefined8 *)(lVar5 + 0x18);
          auVar58._0_4_ = auVar75._0_4_ * fVar134;
          auVar58._4_4_ = auVar75._4_4_ * fVar134;
          auVar58._8_4_ = auVar75._8_4_ * fVar134;
          auVar58._12_4_ = auVar75._12_4_ * fVar134;
          uStack_10d0 = local_10e0;
          uStack_10c8 = uStack_10d8;
          lVar33 = uVar40 + 0x50 + lVar33;
          local_1320 = *(undefined8 *)(lVar33 + 0x10);
          uStack_1318 = *(undefined8 *)(lVar33 + 0x18);
          auVar64 = vfmadd231ps_fma(auVar116,auVar157,local_1340);
          auVar75 = vfmadd231ps_fma(auVar120,auVar157,local_1350);
          auVar101 = vfmadd231ps_fma(auVar58,auVar157,auVar102);
          uStack_1310 = local_1320;
          uStack_1308 = uStack_1318;
          auVar68._16_16_ = auVar76;
          auVar68._0_16_ = auVar78;
          auVar89._16_16_ = auVar93;
          auVar89._0_16_ = auVar63;
          auVar95._16_16_ = auVar77;
          auVar95._0_16_ = auVar86;
          auVar131._16_16_ = auVar87;
          auVar131._0_16_ = auVar87;
          auVar104._16_16_ = auVar85;
          auVar104._0_16_ = auVar85;
          auVar79._16_16_ = auVar92;
          auVar79._0_16_ = auVar92;
          auVar165._16_16_ = auVar64;
          auVar165._0_16_ = auVar64;
          auVar121._16_16_ = auVar75;
          auVar121._0_16_ = auVar75;
          uVar146 = *(undefined4 *)(ray + k * 4);
          auVar141._4_4_ = uVar146;
          auVar141._0_4_ = uVar146;
          auVar141._8_4_ = uVar146;
          auVar141._12_4_ = uVar146;
          auVar141._16_4_ = uVar146;
          auVar141._20_4_ = uVar146;
          auVar141._24_4_ = uVar146;
          auVar141._28_4_ = uVar146;
          uVar146 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar147._4_4_ = uVar146;
          auVar147._0_4_ = uVar146;
          auVar147._8_4_ = uVar146;
          auVar147._12_4_ = uVar146;
          auVar147._16_4_ = uVar146;
          auVar147._20_4_ = uVar146;
          auVar147._24_4_ = uVar146;
          auVar147._28_4_ = uVar146;
          auVar59._16_16_ = auVar101;
          auVar59._0_16_ = auVar101;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar158._4_4_ = uVar1;
          auVar158._0_4_ = uVar1;
          auVar158._8_4_ = uVar1;
          auVar158._12_4_ = uVar1;
          auVar158._16_4_ = uVar1;
          auVar158._20_4_ = uVar1;
          auVar158._24_4_ = uVar1;
          auVar158._28_4_ = uVar1;
          auVar68 = vsubps_avx(auVar68,auVar141);
          local_15a0 = vsubps_avx(auVar89,auVar147);
          local_1440 = vsubps_avx(auVar95,auVar158);
          auVar66 = vsubps_avx(auVar131,auVar141);
          auVar67 = vsubps_avx(auVar104,auVar147);
          auVar72 = vsubps_avx(auVar79,auVar158);
          auVar79 = vsubps_avx(auVar165,auVar141);
          auVar89 = vsubps_avx(auVar121,auVar147);
          auVar9 = vsubps_avx(auVar59,auVar158);
          local_1460 = vsubps_avx(auVar79,auVar68);
          local_14a0 = vsubps_avx(auVar89,local_15a0);
          local_1480 = vsubps_avx(auVar9,local_1440);
          auVar60._0_4_ = auVar68._0_4_ + auVar79._0_4_;
          auVar60._4_4_ = auVar68._4_4_ + auVar79._4_4_;
          auVar60._8_4_ = auVar68._8_4_ + auVar79._8_4_;
          auVar60._12_4_ = auVar68._12_4_ + auVar79._12_4_;
          auVar60._16_4_ = auVar68._16_4_ + auVar79._16_4_;
          auVar60._20_4_ = auVar68._20_4_ + auVar79._20_4_;
          auVar60._24_4_ = auVar68._24_4_ + auVar79._24_4_;
          auVar60._28_4_ = auVar68._28_4_ + auVar79._28_4_;
          auVar80._0_4_ = auVar89._0_4_ + local_15a0._0_4_;
          auVar80._4_4_ = auVar89._4_4_ + local_15a0._4_4_;
          auVar80._8_4_ = auVar89._8_4_ + local_15a0._8_4_;
          auVar80._12_4_ = auVar89._12_4_ + local_15a0._12_4_;
          auVar80._16_4_ = auVar89._16_4_ + local_15a0._16_4_;
          auVar80._20_4_ = auVar89._20_4_ + local_15a0._20_4_;
          auVar80._24_4_ = auVar89._24_4_ + local_15a0._24_4_;
          fVar100 = local_15a0._28_4_;
          auVar80._28_4_ = auVar89._28_4_ + fVar100;
          fVar137 = local_1440._0_4_;
          auVar96._0_4_ = auVar9._0_4_ + fVar137;
          fVar138 = local_1440._4_4_;
          auVar96._4_4_ = auVar9._4_4_ + fVar138;
          fVar139 = local_1440._8_4_;
          auVar96._8_4_ = auVar9._8_4_ + fVar139;
          fVar140 = local_1440._12_4_;
          auVar96._12_4_ = auVar9._12_4_ + fVar140;
          fVar142 = local_1440._16_4_;
          auVar96._16_4_ = auVar9._16_4_ + fVar142;
          fVar143 = local_1440._20_4_;
          auVar96._20_4_ = auVar9._20_4_ + fVar143;
          fVar144 = local_1440._24_4_;
          auVar96._24_4_ = auVar9._24_4_ + fVar144;
          auVar96._28_4_ = auVar9._28_4_ + local_1440._28_4_;
          auVar10._4_4_ = local_1480._4_4_ * auVar80._4_4_;
          auVar10._0_4_ = local_1480._0_4_ * auVar80._0_4_;
          auVar10._8_4_ = local_1480._8_4_ * auVar80._8_4_;
          auVar10._12_4_ = local_1480._12_4_ * auVar80._12_4_;
          auVar10._16_4_ = local_1480._16_4_ * auVar80._16_4_;
          auVar10._20_4_ = local_1480._20_4_ * auVar80._20_4_;
          auVar10._24_4_ = local_1480._24_4_ * auVar80._24_4_;
          auVar10._28_4_ = uVar146;
          auVar75 = vfmsub231ps_fma(auVar10,local_14a0,auVar96);
          auVar11._4_4_ = local_1460._4_4_ * auVar96._4_4_;
          auVar11._0_4_ = local_1460._0_4_ * auVar96._0_4_;
          auVar11._8_4_ = local_1460._8_4_ * auVar96._8_4_;
          auVar11._12_4_ = local_1460._12_4_ * auVar96._12_4_;
          auVar11._16_4_ = local_1460._16_4_ * auVar96._16_4_;
          auVar11._20_4_ = local_1460._20_4_ * auVar96._20_4_;
          auVar11._24_4_ = local_1460._24_4_ * auVar96._24_4_;
          auVar11._28_4_ = auVar96._28_4_;
          auVar64 = vfmsub231ps_fma(auVar11,local_1480,auVar60);
          auVar13._4_4_ = local_14a0._4_4_ * auVar60._4_4_;
          auVar13._0_4_ = local_14a0._0_4_ * auVar60._0_4_;
          auVar13._8_4_ = local_14a0._8_4_ * auVar60._8_4_;
          auVar13._12_4_ = local_14a0._12_4_ * auVar60._12_4_;
          auVar13._16_4_ = local_14a0._16_4_ * auVar60._16_4_;
          auVar13._20_4_ = local_14a0._20_4_ * auVar60._20_4_;
          auVar13._24_4_ = local_14a0._24_4_ * auVar60._24_4_;
          auVar13._28_4_ = auVar60._28_4_;
          auVar63 = vfmsub231ps_fma(auVar13,local_1460,auVar80);
          uVar146 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar159._4_4_ = uVar146;
          auVar159._0_4_ = uVar146;
          auVar159._8_4_ = uVar146;
          auVar159._12_4_ = uVar146;
          auVar159._16_4_ = uVar146;
          auVar159._20_4_ = uVar146;
          auVar159._24_4_ = uVar146;
          auVar159._28_4_ = uVar146;
          fVar134 = *(float *)(ray + k * 4 + 0xc0);
          auVar14._4_4_ = fVar134 * auVar63._4_4_;
          auVar14._0_4_ = fVar134 * auVar63._0_4_;
          auVar14._8_4_ = fVar134 * auVar63._8_4_;
          auVar14._12_4_ = fVar134 * auVar63._12_4_;
          auVar14._16_4_ = fVar134 * 0.0;
          auVar14._20_4_ = fVar134 * 0.0;
          auVar14._24_4_ = fVar134 * 0.0;
          auVar14._28_4_ = local_1480._28_4_;
          auVar64 = vfmadd231ps_fma(auVar14,auVar159,ZEXT1632(auVar64));
          uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar117._4_4_ = uVar146;
          auVar117._0_4_ = uVar146;
          auVar117._8_4_ = uVar146;
          auVar117._12_4_ = uVar146;
          auVar117._16_4_ = uVar146;
          auVar117._20_4_ = uVar146;
          auVar117._24_4_ = uVar146;
          auVar117._28_4_ = uVar146;
          local_1300 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar117,ZEXT1632(auVar75));
          local_14c0 = vsubps_avx(local_15a0,auVar67);
          local_14e0 = vsubps_avx(local_1440,auVar72);
          auVar81._0_4_ = auVar67._0_4_ + local_15a0._0_4_;
          auVar81._4_4_ = auVar67._4_4_ + local_15a0._4_4_;
          auVar81._8_4_ = auVar67._8_4_ + local_15a0._8_4_;
          auVar81._12_4_ = auVar67._12_4_ + local_15a0._12_4_;
          auVar81._16_4_ = auVar67._16_4_ + local_15a0._16_4_;
          auVar81._20_4_ = auVar67._20_4_ + local_15a0._20_4_;
          auVar81._24_4_ = auVar67._24_4_ + local_15a0._24_4_;
          auVar81._28_4_ = auVar67._28_4_ + fVar100;
          auVar97._0_4_ = fVar137 + auVar72._0_4_;
          auVar97._4_4_ = fVar138 + auVar72._4_4_;
          auVar97._8_4_ = fVar139 + auVar72._8_4_;
          auVar97._12_4_ = fVar140 + auVar72._12_4_;
          auVar97._16_4_ = fVar142 + auVar72._16_4_;
          auVar97._20_4_ = fVar143 + auVar72._20_4_;
          auVar97._24_4_ = fVar144 + auVar72._24_4_;
          auVar97._28_4_ = local_1440._28_4_ + auVar72._28_4_;
          fVar145 = local_14e0._0_4_;
          fVar149 = local_14e0._4_4_;
          auVar15._4_4_ = fVar149 * auVar81._4_4_;
          auVar15._0_4_ = fVar145 * auVar81._0_4_;
          fVar150 = local_14e0._8_4_;
          auVar15._8_4_ = fVar150 * auVar81._8_4_;
          fVar151 = local_14e0._12_4_;
          auVar15._12_4_ = fVar151 * auVar81._12_4_;
          fVar153 = local_14e0._16_4_;
          auVar15._16_4_ = fVar153 * auVar81._16_4_;
          fVar154 = local_14e0._20_4_;
          auVar15._20_4_ = fVar154 * auVar81._20_4_;
          fVar155 = local_14e0._24_4_;
          auVar15._24_4_ = fVar155 * auVar81._24_4_;
          auVar15._28_4_ = fVar100;
          auVar75 = vfmsub231ps_fma(auVar15,local_14c0,auVar97);
          auVar10 = vsubps_avx(auVar68,auVar66);
          fVar100 = auVar10._0_4_;
          fVar107 = auVar10._4_4_;
          auVar16._4_4_ = auVar97._4_4_ * fVar107;
          auVar16._0_4_ = auVar97._0_4_ * fVar100;
          fVar109 = auVar10._8_4_;
          auVar16._8_4_ = auVar97._8_4_ * fVar109;
          fVar111 = auVar10._12_4_;
          auVar16._12_4_ = auVar97._12_4_ * fVar111;
          fVar156 = auVar10._16_4_;
          auVar16._16_4_ = auVar97._16_4_ * fVar156;
          fVar161 = auVar10._20_4_;
          auVar16._20_4_ = auVar97._20_4_ * fVar161;
          fVar163 = auVar10._24_4_;
          auVar16._24_4_ = auVar97._24_4_ * fVar163;
          auVar16._28_4_ = auVar97._28_4_;
          auVar122._0_4_ = auVar68._0_4_ + auVar66._0_4_;
          auVar122._4_4_ = auVar68._4_4_ + auVar66._4_4_;
          auVar122._8_4_ = auVar68._8_4_ + auVar66._8_4_;
          auVar122._12_4_ = auVar68._12_4_ + auVar66._12_4_;
          auVar122._16_4_ = auVar68._16_4_ + auVar66._16_4_;
          auVar122._20_4_ = auVar68._20_4_ + auVar66._20_4_;
          auVar122._24_4_ = auVar68._24_4_ + auVar66._24_4_;
          auVar122._28_4_ = auVar68._28_4_ + auVar66._28_4_;
          auVar64 = vfmsub231ps_fma(auVar16,local_14e0,auVar122);
          fVar106 = local_14c0._0_4_;
          fVar108 = local_14c0._4_4_;
          auVar17._4_4_ = auVar122._4_4_ * fVar108;
          auVar17._0_4_ = auVar122._0_4_ * fVar106;
          fVar110 = local_14c0._8_4_;
          auVar17._8_4_ = auVar122._8_4_ * fVar110;
          fVar152 = local_14c0._12_4_;
          auVar17._12_4_ = auVar122._12_4_ * fVar152;
          fVar160 = local_14c0._16_4_;
          auVar17._16_4_ = auVar122._16_4_ * fVar160;
          fVar162 = local_14c0._20_4_;
          auVar17._20_4_ = auVar122._20_4_ * fVar162;
          fVar166 = local_14c0._24_4_;
          auVar17._24_4_ = auVar122._24_4_ * fVar166;
          auVar17._28_4_ = auVar122._28_4_;
          auVar63 = vfmsub231ps_fma(auVar17,auVar10,auVar81);
          auVar18._4_4_ = auVar63._4_4_ * fVar134;
          auVar18._0_4_ = auVar63._0_4_ * fVar134;
          auVar18._8_4_ = auVar63._8_4_ * fVar134;
          auVar18._12_4_ = auVar63._12_4_ * fVar134;
          auVar18._16_4_ = fVar134 * 0.0;
          auVar18._20_4_ = fVar134 * 0.0;
          auVar18._24_4_ = fVar134 * 0.0;
          auVar18._28_4_ = auVar81._28_4_;
          auVar64 = vfmadd231ps_fma(auVar18,auVar159,ZEXT1632(auVar64));
          auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar117,ZEXT1632(auVar75));
          auVar11 = vsubps_avx(auVar66,auVar79);
          auVar90._0_4_ = auVar66._0_4_ + auVar79._0_4_;
          auVar90._4_4_ = auVar66._4_4_ + auVar79._4_4_;
          auVar90._8_4_ = auVar66._8_4_ + auVar79._8_4_;
          auVar90._12_4_ = auVar66._12_4_ + auVar79._12_4_;
          auVar90._16_4_ = auVar66._16_4_ + auVar79._16_4_;
          auVar90._20_4_ = auVar66._20_4_ + auVar79._20_4_;
          auVar90._24_4_ = auVar66._24_4_ + auVar79._24_4_;
          auVar90._28_4_ = auVar66._28_4_ + auVar79._28_4_;
          auVar79 = vsubps_avx(auVar67,auVar89);
          auVar105._0_4_ = auVar67._0_4_ + auVar89._0_4_;
          auVar105._4_4_ = auVar67._4_4_ + auVar89._4_4_;
          auVar105._8_4_ = auVar67._8_4_ + auVar89._8_4_;
          auVar105._12_4_ = auVar67._12_4_ + auVar89._12_4_;
          auVar105._16_4_ = auVar67._16_4_ + auVar89._16_4_;
          auVar105._20_4_ = auVar67._20_4_ + auVar89._20_4_;
          auVar105._24_4_ = auVar67._24_4_ + auVar89._24_4_;
          auVar105._28_4_ = auVar67._28_4_ + auVar89._28_4_;
          auVar89 = vsubps_avx(auVar72,auVar9);
          auVar69._0_4_ = auVar72._0_4_ + auVar9._0_4_;
          auVar69._4_4_ = auVar72._4_4_ + auVar9._4_4_;
          auVar69._8_4_ = auVar72._8_4_ + auVar9._8_4_;
          auVar69._12_4_ = auVar72._12_4_ + auVar9._12_4_;
          auVar69._16_4_ = auVar72._16_4_ + auVar9._16_4_;
          auVar69._20_4_ = auVar72._20_4_ + auVar9._20_4_;
          auVar69._24_4_ = auVar72._24_4_ + auVar9._24_4_;
          auVar69._28_4_ = auVar72._28_4_ + auVar9._28_4_;
          auVar113._0_4_ = auVar89._0_4_ * auVar105._0_4_;
          auVar113._4_4_ = auVar89._4_4_ * auVar105._4_4_;
          auVar113._8_4_ = auVar89._8_4_ * auVar105._8_4_;
          auVar113._12_4_ = auVar89._12_4_ * auVar105._12_4_;
          auVar113._16_4_ = auVar89._16_4_ * auVar105._16_4_;
          auVar113._20_4_ = auVar89._20_4_ * auVar105._20_4_;
          auVar113._24_4_ = auVar89._24_4_ * auVar105._24_4_;
          auVar113._28_4_ = 0;
          auVar63 = vfmsub231ps_fma(auVar113,auVar79,auVar69);
          auVar9._4_4_ = auVar69._4_4_ * auVar11._4_4_;
          auVar9._0_4_ = auVar69._0_4_ * auVar11._0_4_;
          auVar9._8_4_ = auVar69._8_4_ * auVar11._8_4_;
          auVar9._12_4_ = auVar69._12_4_ * auVar11._12_4_;
          auVar9._16_4_ = auVar69._16_4_ * auVar11._16_4_;
          auVar9._20_4_ = auVar69._20_4_ * auVar11._20_4_;
          auVar9._24_4_ = auVar69._24_4_ * auVar11._24_4_;
          auVar9._28_4_ = auVar69._28_4_;
          auVar75 = vfmsub231ps_fma(auVar9,auVar89,auVar90);
          auVar19._4_4_ = auVar79._4_4_ * auVar90._4_4_;
          auVar19._0_4_ = auVar79._0_4_ * auVar90._0_4_;
          auVar19._8_4_ = auVar79._8_4_ * auVar90._8_4_;
          auVar19._12_4_ = auVar79._12_4_ * auVar90._12_4_;
          auVar19._16_4_ = auVar79._16_4_ * auVar90._16_4_;
          auVar19._20_4_ = auVar79._20_4_ * auVar90._20_4_;
          auVar19._24_4_ = auVar79._24_4_ * auVar90._24_4_;
          auVar19._28_4_ = auVar90._28_4_;
          auVar85 = vfmsub231ps_fma(auVar19,auVar11,auVar105);
          auVar91._0_4_ = fVar134 * auVar85._0_4_;
          auVar91._4_4_ = fVar134 * auVar85._4_4_;
          auVar91._8_4_ = fVar134 * auVar85._8_4_;
          auVar91._12_4_ = fVar134 * auVar85._12_4_;
          auVar91._16_4_ = fVar134 * 0.0;
          auVar91._20_4_ = fVar134 * 0.0;
          auVar91._24_4_ = fVar134 * 0.0;
          auVar91._28_4_ = 0;
          auVar75 = vfmadd231ps_fma(auVar91,auVar159,ZEXT1632(auVar75));
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar117,ZEXT1632(auVar63));
          local_12c0 = ZEXT1632(CONCAT412(auVar75._12_4_ + local_1300._12_4_ + auVar64._12_4_,
                                          CONCAT48(auVar75._8_4_ + local_1300._8_4_ + auVar64._8_4_,
                                                   CONCAT44(auVar75._4_4_ +
                                                            local_1300._4_4_ + auVar64._4_4_,
                                                            auVar75._0_4_ +
                                                            local_1300._0_4_ + auVar64._0_4_))));
          auVar70._8_4_ = 0x7fffffff;
          auVar70._0_8_ = 0x7fffffff7fffffff;
          auVar70._12_4_ = 0x7fffffff;
          auVar70._16_4_ = 0x7fffffff;
          auVar70._20_4_ = 0x7fffffff;
          auVar70._24_4_ = 0x7fffffff;
          auVar70._28_4_ = 0x7fffffff;
          local_1520 = ZEXT1632(local_1300);
          auVar66 = vminps_avx(local_1520,ZEXT1632(auVar64));
          auVar66 = vminps_avx(auVar66,ZEXT1632(auVar75));
          local_1540 = vandps_avx(local_12c0,auVar70);
          fVar119 = local_1540._0_4_ * 1.1920929e-07;
          fVar124 = local_1540._4_4_ * 1.1920929e-07;
          auVar20._4_4_ = fVar124;
          auVar20._0_4_ = fVar119;
          fVar125 = local_1540._8_4_ * 1.1920929e-07;
          auVar20._8_4_ = fVar125;
          fVar126 = local_1540._12_4_ * 1.1920929e-07;
          auVar20._12_4_ = fVar126;
          fVar127 = local_1540._16_4_ * 1.1920929e-07;
          auVar20._16_4_ = fVar127;
          fVar128 = local_1540._20_4_ * 1.1920929e-07;
          auVar20._20_4_ = fVar128;
          fVar129 = local_1540._24_4_ * 1.1920929e-07;
          auVar20._24_4_ = fVar129;
          auVar20._28_4_ = 0x34000000;
          auVar114._0_8_ = CONCAT44(fVar124,fVar119) ^ 0x8000000080000000;
          auVar114._8_4_ = -fVar125;
          auVar114._12_4_ = -fVar126;
          auVar114._16_4_ = -fVar127;
          auVar114._20_4_ = -fVar128;
          auVar114._24_4_ = -fVar129;
          auVar114._28_4_ = 0xb4000000;
          auVar66 = vcmpps_avx(auVar66,auVar114,5);
          auVar72 = vmaxps_avx(local_1520,ZEXT1632(auVar64));
          auVar67 = vmaxps_avx(auVar72,ZEXT1632(auVar75));
          auVar67 = vcmpps_avx(auVar67,auVar20,2);
          auVar67 = vorps_avx(auVar66,auVar67);
          if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar67 >> 0x7f,0) != '\0') ||
                (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar67 >> 0xbf,0) != '\0') ||
              (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar67[0x1f] < '\0') {
            auVar21._4_4_ = fVar108 * local_1480._4_4_;
            auVar21._0_4_ = fVar106 * local_1480._0_4_;
            auVar21._8_4_ = fVar110 * local_1480._8_4_;
            auVar21._12_4_ = fVar152 * local_1480._12_4_;
            auVar21._16_4_ = fVar160 * local_1480._16_4_;
            auVar21._20_4_ = fVar162 * local_1480._20_4_;
            auVar21._24_4_ = fVar166 * local_1480._24_4_;
            auVar21._28_4_ = auVar66._28_4_;
            local_1500 = fVar100 * local_14a0._0_4_;
            fStack_14fc = fVar107 * local_14a0._4_4_;
            fStack_14f8 = fVar109 * local_14a0._8_4_;
            fStack_14f4 = fVar111 * local_14a0._12_4_;
            fStack_14f0 = fVar156 * local_14a0._16_4_;
            fStack_14ec = fVar161 * local_14a0._20_4_;
            uStack_14e4 = auVar72._28_4_;
            fStack_14e8 = fVar163 * local_14a0._24_4_;
            auVar75 = vfmsub213ps_fma(local_14a0,local_14e0,auVar21);
            auVar22._4_4_ = auVar79._4_4_ * fVar149;
            auVar22._0_4_ = auVar79._0_4_ * fVar145;
            auVar22._8_4_ = auVar79._8_4_ * fVar150;
            auVar22._12_4_ = auVar79._12_4_ * fVar151;
            auVar22._16_4_ = auVar79._16_4_ * fVar153;
            auVar22._20_4_ = auVar79._20_4_ * fVar154;
            auVar22._24_4_ = auVar79._24_4_ * fVar155;
            auVar22._28_4_ = uStack_14e4;
            auVar23._4_4_ = auVar89._4_4_ * fVar107;
            auVar23._0_4_ = auVar89._0_4_ * fVar100;
            auVar23._8_4_ = auVar89._8_4_ * fVar109;
            auVar23._12_4_ = auVar89._12_4_ * fVar111;
            auVar23._16_4_ = auVar89._16_4_ * fVar156;
            auVar23._20_4_ = auVar89._20_4_ * fVar161;
            auVar23._24_4_ = auVar89._24_4_ * fVar163;
            auVar23._28_4_ = local_1540._28_4_;
            auVar63 = vfmsub213ps_fma(auVar89,local_14c0,auVar22);
            auVar66 = vandps_avx(auVar21,auVar70);
            auVar72 = vandps_avx(auVar22,auVar70);
            auVar66 = vcmpps_avx(auVar66,auVar72,1);
            local_12a0 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar75),auVar66);
            auVar24._4_4_ = fVar108 * auVar11._4_4_;
            auVar24._0_4_ = fVar106 * auVar11._0_4_;
            auVar24._8_4_ = fVar110 * auVar11._8_4_;
            auVar24._12_4_ = fVar152 * auVar11._12_4_;
            auVar24._16_4_ = fVar160 * auVar11._16_4_;
            auVar24._20_4_ = fVar162 * auVar11._20_4_;
            auVar24._24_4_ = fVar166 * auVar11._24_4_;
            auVar24._28_4_ = auVar66._28_4_;
            auVar75 = vfmsub213ps_fma(auVar11,local_14e0,auVar23);
            auVar25._4_4_ = local_1460._4_4_ * fVar149;
            auVar25._0_4_ = local_1460._0_4_ * fVar145;
            auVar25._8_4_ = local_1460._8_4_ * fVar150;
            auVar25._12_4_ = local_1460._12_4_ * fVar151;
            auVar25._16_4_ = local_1460._16_4_ * fVar153;
            auVar25._20_4_ = local_1460._20_4_ * fVar154;
            auVar25._24_4_ = local_1460._24_4_ * fVar155;
            auVar25._28_4_ = auVar72._28_4_;
            auVar63 = vfmsub213ps_fma(local_1480,auVar10,auVar25);
            auVar66 = vandps_avx(auVar25,auVar70);
            auVar72 = vandps_avx(auVar23,auVar70);
            auVar66 = vcmpps_avx(auVar66,auVar72,1);
            local_1280 = vblendvps_avx(ZEXT1632(auVar75),ZEXT1632(auVar63),auVar66);
            auVar28._4_4_ = fStack_14fc;
            auVar28._0_4_ = local_1500;
            auVar28._8_4_ = fStack_14f8;
            auVar28._12_4_ = fStack_14f4;
            auVar28._16_4_ = fStack_14f0;
            auVar28._20_4_ = fStack_14ec;
            auVar28._24_4_ = fStack_14e8;
            auVar28._28_4_ = uStack_14e4;
            auVar75 = vfmsub213ps_fma(local_1460,local_14c0,auVar28);
            auVar63 = vfmsub213ps_fma(auVar79,auVar10,auVar24);
            auVar66 = vandps_avx(auVar28,auVar70);
            auVar72 = vandps_avx(auVar24,auVar70);
            auVar72 = vcmpps_avx(auVar66,auVar72,1);
            local_1260 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar75),auVar72);
            auVar75 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
            fVar100 = local_1260._0_4_;
            auVar71._0_4_ = fVar100 * fVar134;
            fVar106 = local_1260._4_4_;
            auVar71._4_4_ = fVar106 * fVar134;
            fVar107 = local_1260._8_4_;
            auVar71._8_4_ = fVar107 * fVar134;
            fVar108 = local_1260._12_4_;
            auVar71._12_4_ = fVar108 * fVar134;
            fVar109 = local_1260._16_4_;
            auVar71._16_4_ = fVar109 * fVar134;
            fVar110 = local_1260._20_4_;
            auVar71._20_4_ = fVar110 * fVar134;
            fVar111 = local_1260._24_4_;
            auVar71._24_4_ = fVar111 * fVar134;
            auVar71._28_4_ = 0;
            auVar63 = vfmadd213ps_fma(auVar159,local_1280,auVar71);
            auVar63 = vfmadd213ps_fma(auVar117,local_12a0,ZEXT1632(auVar63));
            auVar72 = ZEXT1632(CONCAT412(auVar63._12_4_ + auVar63._12_4_,
                                         CONCAT48(auVar63._8_4_ + auVar63._8_4_,
                                                  CONCAT44(auVar63._4_4_ + auVar63._4_4_,
                                                           auVar63._0_4_ + auVar63._0_4_))));
            auVar26._4_4_ = fVar106 * fVar138;
            auVar26._0_4_ = fVar100 * fVar137;
            auVar26._8_4_ = fVar107 * fVar139;
            auVar26._12_4_ = fVar108 * fVar140;
            auVar26._16_4_ = fVar109 * fVar142;
            auVar26._20_4_ = fVar110 * fVar143;
            auVar26._24_4_ = fVar111 * fVar144;
            auVar26._28_4_ = auVar66._28_4_;
            auVar63 = vfmadd213ps_fma(local_15a0,local_1280,auVar26);
            auVar85 = vfmadd213ps_fma(auVar68,local_12a0,ZEXT1632(auVar63));
            auVar66 = vrcpps_avx(auVar72);
            auVar136._8_4_ = 0x3f800000;
            auVar136._0_8_ = 0x3f8000003f800000;
            auVar136._12_4_ = 0x3f800000;
            auVar136._16_4_ = 0x3f800000;
            auVar136._20_4_ = 0x3f800000;
            auVar136._24_4_ = 0x3f800000;
            auVar136._28_4_ = 0x3f800000;
            auVar63 = vfnmadd213ps_fma(auVar66,auVar72,auVar136);
            auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar66,auVar66);
            local_11e0._28_4_ = 0x3f800000;
            local_11e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar63._12_4_ * (auVar85._12_4_ + auVar85._12_4_),
                                    CONCAT48(auVar63._8_4_ * (auVar85._8_4_ + auVar85._8_4_),
                                             CONCAT44(auVar63._4_4_ *
                                                      (auVar85._4_4_ + auVar85._4_4_),
                                                      auVar63._0_4_ *
                                                      (auVar85._0_4_ + auVar85._0_4_)))));
            auVar115 = ZEXT3264(local_11e0);
            uVar146 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar98._4_4_ = uVar146;
            auVar98._0_4_ = uVar146;
            auVar98._8_4_ = uVar146;
            auVar98._12_4_ = uVar146;
            auVar98._16_4_ = uVar146;
            auVar98._20_4_ = uVar146;
            auVar98._24_4_ = uVar146;
            auVar98._28_4_ = uVar146;
            uVar146 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar148._4_4_ = uVar146;
            auVar148._0_4_ = uVar146;
            auVar148._8_4_ = uVar146;
            auVar148._12_4_ = uVar146;
            auVar148._16_4_ = uVar146;
            auVar148._20_4_ = uVar146;
            auVar148._24_4_ = uVar146;
            auVar148._28_4_ = uVar146;
            auVar62 = ZEXT3264(auVar148);
            auVar66 = vcmpps_avx(auVar98,local_11e0,2);
            auVar67 = vcmpps_avx(local_11e0,auVar148,2);
            auVar66 = vandps_avx(auVar67,auVar66);
            auVar63 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
            auVar75 = vpand_avx(auVar63,auVar75);
            auVar66 = vpmovsxwd_avx2(auVar75);
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar66 >> 0x7f,0) != '\0') ||
                  (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0xbf,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar66[0x1f] < '\0') {
              auVar66 = vcmpps_avx(auVar72,_DAT_01faff00,4);
              auVar63 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
              auVar75 = vpand_avx(auVar75,auVar63);
              local_1580 = vpmovsxwd_avx2(auVar75);
              if ((((((((local_1580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1580 >> 0x7f,0) != '\0') ||
                    (local_1580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1580 >> 0xbf,0) != '\0') ||
                  (local_1580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1580[0x1f] < '\0') {
                uStack_12f0 = 0;
                uStack_12ec = 0;
                uStack_12e8 = 0;
                uStack_12e4 = 0;
                local_12e0 = ZEXT1632(auVar64);
                local_1240 = local_1580;
                local_1160 = local_1100;
                auVar66 = vrcpps_avx(local_12c0);
                auVar132._8_4_ = 0x3f800000;
                auVar132._0_8_ = 0x3f8000003f800000;
                auVar132._12_4_ = 0x3f800000;
                auVar132._16_4_ = 0x3f800000;
                auVar132._20_4_ = 0x3f800000;
                auVar132._24_4_ = 0x3f800000;
                auVar132._28_4_ = 0x3f800000;
                auVar63 = vfnmadd213ps_fma(local_12c0,auVar66,auVar132);
                auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar66,auVar66);
                auVar99._8_4_ = 0x219392ef;
                auVar99._0_8_ = 0x219392ef219392ef;
                auVar99._12_4_ = 0x219392ef;
                auVar99._16_4_ = 0x219392ef;
                auVar99._20_4_ = 0x219392ef;
                auVar99._24_4_ = 0x219392ef;
                auVar99._28_4_ = 0x219392ef;
                auVar66 = vcmpps_avx(local_1540,auVar99,5);
                auVar66 = vandps_avx(auVar66,ZEXT1632(auVar63));
                auVar27._4_4_ = local_1300._4_4_ * auVar66._4_4_;
                auVar27._0_4_ = local_1300._0_4_ * auVar66._0_4_;
                auVar27._8_4_ = local_1300._8_4_ * auVar66._8_4_;
                auVar27._12_4_ = local_1300._12_4_ * auVar66._12_4_;
                auVar27._16_4_ = auVar66._16_4_ * 0.0;
                auVar27._20_4_ = auVar66._20_4_ * 0.0;
                auVar27._24_4_ = auVar66._24_4_ * 0.0;
                auVar27._28_4_ = 0;
                auVar67 = vminps_avx(auVar27,auVar132);
                auVar82._0_4_ = auVar64._0_4_ * auVar66._0_4_;
                auVar82._4_4_ = auVar64._4_4_ * auVar66._4_4_;
                auVar82._8_4_ = auVar64._8_4_ * auVar66._8_4_;
                auVar82._12_4_ = auVar64._12_4_ * auVar66._12_4_;
                auVar82._16_4_ = auVar66._16_4_ * 0.0;
                auVar82._20_4_ = auVar66._20_4_ * 0.0;
                auVar82._24_4_ = auVar66._24_4_ * 0.0;
                auVar82._28_4_ = 0;
                auVar66 = vminps_avx(auVar82,auVar132);
                auVar72 = vsubps_avx(auVar132,auVar67);
                auVar68 = vsubps_avx(auVar132,auVar66);
                local_1200 = vblendvps_avx(auVar66,auVar72,local_1100);
                local_1220 = vblendvps_avx(auVar67,auVar68,local_1100);
                local_11c0[0] = local_12a0._0_4_ * (float)local_1120._0_4_;
                local_11c0[1] = local_12a0._4_4_ * (float)local_1120._4_4_;
                local_11c0[2] = local_12a0._8_4_ * fStack_1118;
                local_11c0[3] = local_12a0._12_4_ * fStack_1114;
                fStack_11b0 = local_12a0._16_4_ * fStack_1110;
                fStack_11ac = local_12a0._20_4_ * fStack_110c;
                fStack_11a8 = local_12a0._24_4_ * fStack_1108;
                uStack_11a4 = local_1220._28_4_;
                local_11a0[0] = (float)local_1120._0_4_ * local_1280._0_4_;
                local_11a0[1] = (float)local_1120._4_4_ * local_1280._4_4_;
                local_11a0[2] = fStack_1118 * local_1280._8_4_;
                local_11a0[3] = fStack_1114 * local_1280._12_4_;
                fStack_1190 = fStack_1110 * local_1280._16_4_;
                fStack_118c = fStack_110c * local_1280._20_4_;
                fStack_1188 = fStack_1108 * local_1280._24_4_;
                uStack_1184 = local_1200._28_4_;
                local_1180[0] = (float)local_1120._0_4_ * fVar100;
                local_1180[1] = (float)local_1120._4_4_ * fVar106;
                local_1180[2] = fStack_1118 * fVar107;
                local_1180[3] = fStack_1114 * fVar108;
                fStack_1170 = fStack_1110 * fVar109;
                fStack_116c = fStack_110c * fVar110;
                fStack_1168 = fStack_1108 * fVar111;
                uStack_1164 = uStack_1104;
                auVar66 = vpmovsxwd_avx2(auVar75);
                auVar83._8_4_ = 0x7f800000;
                auVar83._0_8_ = 0x7f8000007f800000;
                auVar83._12_4_ = 0x7f800000;
                auVar83._16_4_ = 0x7f800000;
                auVar83._20_4_ = 0x7f800000;
                auVar83._24_4_ = 0x7f800000;
                auVar83._28_4_ = 0x7f800000;
                auVar66 = vblendvps_avx(auVar83,local_11e0,auVar66);
                auVar67 = vshufps_avx(auVar66,auVar66,0xb1);
                auVar67 = vminps_avx(auVar66,auVar67);
                auVar72 = vshufpd_avx(auVar67,auVar67,5);
                auVar67 = vminps_avx(auVar67,auVar72);
                auVar72 = vpermpd_avx2(auVar67,0x4e);
                auVar67 = vminps_avx(auVar67,auVar72);
                auVar66 = vcmpps_avx(auVar66,auVar67,0);
                auVar64 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
                auVar64 = vpand_avx(auVar64,auVar75);
                auVar66 = vpmovsxwd_avx2(auVar64);
                if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0x7f,0) == '\0') &&
                      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0xbf,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar66[0x1f]) {
                  auVar66 = local_1580;
                }
                auVar118 = ZEXT3264(auVar66);
LAB_00586ae7:
                uVar31 = vmovmskps_avx(auVar118._0_32_);
                uVar38 = 0;
                for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
                  uVar38 = uVar38 + 1;
                }
                uVar39 = (ulong)uVar38;
                uVar31 = *(uint *)((long)&local_10e0 + uVar39 * 4);
                pGVar48 = (pSVar3->geometries).items[uVar31].ptr;
                if ((pGVar48->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1580 + uVar39 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar48->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar39 = (ulong)(uVar38 << 2);
                    uVar146 = *(undefined4 *)(local_1220 + uVar39);
                    uVar1 = *(undefined4 *)(local_1200 + uVar39);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar39);
                    *(undefined4 *)(ray + k * 4 + 0x180) =
                         *(undefined4 *)((long)local_11c0 + uVar39);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) =
                         *(undefined4 *)((long)local_11a0 + uVar39);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) =
                         *(undefined4 *)((long)local_1180 + uVar39);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar146;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_1320 + uVar39);
                    *(uint *)(ray + k * 4 + 0x240) = uVar31;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_00586f48;
                  }
                  uVar37 = (ulong)(uVar38 * 4);
                  uVar146 = *(undefined4 *)(local_1220 + uVar37);
                  local_1060._4_4_ = uVar146;
                  local_1060._0_4_ = uVar146;
                  local_1060._8_4_ = uVar146;
                  local_1060._12_4_ = uVar146;
                  local_1060._16_4_ = uVar146;
                  local_1060._20_4_ = uVar146;
                  local_1060._24_4_ = uVar146;
                  local_1060._28_4_ = uVar146;
                  local_1040 = *(undefined4 *)(local_1200 + uVar37);
                  uVar146 = *(undefined4 *)((long)&local_1320 + uVar37);
                  local_1020._4_4_ = uVar146;
                  local_1020._0_4_ = uVar146;
                  local_1020._8_4_ = uVar146;
                  local_1020._12_4_ = uVar146;
                  local_1020._16_4_ = uVar146;
                  local_1020._20_4_ = uVar146;
                  local_1020._24_4_ = uVar146;
                  local_1020._28_4_ = uVar146;
                  uVar146 = *(undefined4 *)((long)local_11c0 + uVar37);
                  uVar1 = *(undefined4 *)((long)local_11a0 + uVar37);
                  local_10a0._4_4_ = uVar1;
                  local_10a0._0_4_ = uVar1;
                  local_10a0._8_4_ = uVar1;
                  local_10a0._12_4_ = uVar1;
                  local_10a0._16_4_ = uVar1;
                  local_10a0._20_4_ = uVar1;
                  local_10a0._24_4_ = uVar1;
                  local_10a0._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)((long)local_1180 + uVar37);
                  local_1080._4_4_ = uVar1;
                  local_1080._0_4_ = uVar1;
                  local_1080._8_4_ = uVar1;
                  local_1080._12_4_ = uVar1;
                  local_1080._16_4_ = uVar1;
                  local_1080._20_4_ = uVar1;
                  local_1080._24_4_ = uVar1;
                  local_1080._28_4_ = uVar1;
                  auVar78._4_4_ = uVar31;
                  auVar78._0_4_ = uVar31;
                  auVar78._8_4_ = uVar31;
                  auVar78._12_4_ = uVar31;
                  auVar84._16_4_ = uVar31;
                  auVar84._0_16_ = auVar78;
                  auVar84._20_4_ = uVar31;
                  auVar84._24_4_ = uVar31;
                  auVar84._28_4_ = uVar31;
                  local_10c0[0] = (RTCHitN)(char)uVar146;
                  local_10c0[1] = (RTCHitN)(char)((uint)uVar146 >> 8);
                  local_10c0[2] = (RTCHitN)(char)((uint)uVar146 >> 0x10);
                  local_10c0[3] = (RTCHitN)(char)((uint)uVar146 >> 0x18);
                  local_10c0[4] = (RTCHitN)(char)uVar146;
                  local_10c0[5] = (RTCHitN)(char)((uint)uVar146 >> 8);
                  local_10c0[6] = (RTCHitN)(char)((uint)uVar146 >> 0x10);
                  local_10c0[7] = (RTCHitN)(char)((uint)uVar146 >> 0x18);
                  local_10c0[8] = (RTCHitN)(char)uVar146;
                  local_10c0[9] = (RTCHitN)(char)((uint)uVar146 >> 8);
                  local_10c0[10] = (RTCHitN)(char)((uint)uVar146 >> 0x10);
                  local_10c0[0xb] = (RTCHitN)(char)((uint)uVar146 >> 0x18);
                  local_10c0[0xc] = (RTCHitN)(char)uVar146;
                  local_10c0[0xd] = (RTCHitN)(char)((uint)uVar146 >> 8);
                  local_10c0[0xe] = (RTCHitN)(char)((uint)uVar146 >> 0x10);
                  local_10c0[0xf] = (RTCHitN)(char)((uint)uVar146 >> 0x18);
                  local_10c0[0x10] = (RTCHitN)(char)uVar146;
                  local_10c0[0x11] = (RTCHitN)(char)((uint)uVar146 >> 8);
                  local_10c0[0x12] = (RTCHitN)(char)((uint)uVar146 >> 0x10);
                  local_10c0[0x13] = (RTCHitN)(char)((uint)uVar146 >> 0x18);
                  local_10c0[0x14] = (RTCHitN)(char)uVar146;
                  local_10c0[0x15] = (RTCHitN)(char)((uint)uVar146 >> 8);
                  local_10c0[0x16] = (RTCHitN)(char)((uint)uVar146 >> 0x10);
                  local_10c0[0x17] = (RTCHitN)(char)((uint)uVar146 >> 0x18);
                  local_10c0[0x18] = (RTCHitN)(char)uVar146;
                  local_10c0[0x19] = (RTCHitN)(char)((uint)uVar146 >> 8);
                  local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar146 >> 0x10);
                  local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar146 >> 0x18);
                  local_10c0[0x1c] = (RTCHitN)(char)uVar146;
                  local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar146 >> 8);
                  local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar146 >> 0x10);
                  local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar146 >> 0x18);
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  local_1000 = auVar84;
                  vpcmpeqd_avx2(local_1060,local_1060);
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar37);
                  local_1420 = local_1140;
                  local_15d0.valid = (int *)local_1420;
                  local_15d0.geometryUserPtr = pGVar48->userPtr;
                  local_15d0.context = context->user;
                  local_15d0.hit = local_10c0;
                  local_15d0.N = 8;
                  local_15d0.ray = (RTCRayN *)ray;
                  if (pGVar48->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_15a0._0_8_ = pGVar48;
                    auVar84 = ZEXT1632(auVar78);
                    (*pGVar48->intersectionFilterN)(&local_15d0);
                    auVar62 = ZEXT3264(auVar62._0_32_);
                    auVar115 = ZEXT3264(auVar115._0_32_);
                    pGVar48 = (Geometry *)local_15a0._0_8_;
                  }
                  auVar67 = vpcmpeqd_avx2(local_1420,_DAT_01faff00);
                  auVar72 = vpcmpeqd_avx2(auVar84,auVar84);
                  auVar66 = auVar72 & ~auVar67;
                  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar66 >> 0x7f,0) == '\0') &&
                        (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0xbf,0) == '\0') &&
                      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar66[0x1f]) {
                    auVar67 = auVar67 ^ auVar72;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar48->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar72 = ZEXT1632(auVar72._0_16_);
                      (*p_Var8)(&local_15d0);
                      auVar62 = ZEXT3264(auVar62._0_32_);
                      auVar115 = ZEXT3264(auVar115._0_32_);
                    }
                    auVar68 = vpcmpeqd_avx2(local_1420,_DAT_01faff00);
                    auVar72 = vpcmpeqd_avx2(auVar72,auVar72);
                    auVar67 = auVar68 ^ auVar72;
                    auVar66 = auVar72 & ~auVar68;
                    if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar66 >> 0x7f,0) != '\0') ||
                          (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar66 >> 0xbf,0) != '\0') ||
                        (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar66[0x1f] < '\0') {
                      auVar74._0_4_ = auVar68._0_4_ ^ auVar72._0_4_;
                      auVar74._4_4_ = auVar68._4_4_ ^ auVar72._4_4_;
                      auVar74._8_4_ = auVar68._8_4_ ^ auVar72._8_4_;
                      auVar74._12_4_ = auVar68._12_4_ ^ auVar72._12_4_;
                      auVar74._16_4_ = auVar68._16_4_ ^ auVar72._16_4_;
                      auVar74._20_4_ = auVar68._20_4_ ^ auVar72._20_4_;
                      auVar74._24_4_ = auVar68._24_4_ ^ auVar72._24_4_;
                      auVar74._28_4_ = auVar68._28_4_ ^ auVar72._28_4_;
                      auVar66 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])local_15d0.hit);
                      *(undefined1 (*) [32])(local_15d0.ray + 0x180) = auVar66;
                      auVar66 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])(local_15d0.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_15d0.ray + 0x1a0) = auVar66;
                      auVar66 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])(local_15d0.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_15d0.ray + 0x1c0) = auVar66;
                      auVar66 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])(local_15d0.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_15d0.ray + 0x1e0) = auVar66;
                      auVar66 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])(local_15d0.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_15d0.ray + 0x200) = auVar66;
                      auVar66 = vpmaskmovd_avx2(auVar74,*(undefined1 (*) [32])
                                                         (local_15d0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_15d0.ray + 0x220) = auVar66;
                      auVar66 = vpmaskmovd_avx2(auVar74,*(undefined1 (*) [32])
                                                         (local_15d0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_15d0.ray + 0x240) = auVar66;
                      auVar66 = vpmaskmovd_avx2(auVar74,*(undefined1 (*) [32])
                                                         (local_15d0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_15d0.ray + 0x260) = auVar66;
                      auVar66 = vpmaskmovd_avx2(auVar74,*(undefined1 (*) [32])
                                                         (local_15d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_15d0.ray + 0x280) = auVar66;
                    }
                  }
                  if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar67 >> 0x7f,0) == '\0') &&
                        (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar67 >> 0xbf,0) == '\0') &&
                      (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar67[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar62._0_4_;
                  }
                  else {
                    auVar62 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_1580 + uVar39 * 4) = 0;
                  uVar146 = auVar62._0_4_;
                  auVar61._4_4_ = uVar146;
                  auVar61._0_4_ = uVar146;
                  auVar61._8_4_ = uVar146;
                  auVar61._12_4_ = uVar146;
                  auVar61._16_4_ = uVar146;
                  auVar61._20_4_ = uVar146;
                  auVar61._24_4_ = uVar146;
                  auVar61._28_4_ = uVar146;
                  auVar66 = vcmpps_avx(auVar115._0_32_,auVar61,2);
                  local_1580 = vandps_avx(auVar66,local_1580);
                }
                auVar118 = ZEXT3264(local_1580);
                if ((((((((local_1580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1580 >> 0x7f,0) == '\0') &&
                      (local_1580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1580 >> 0xbf,0) == '\0') &&
                    (local_1580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1580[0x1f]) goto LAB_00586f48;
                auVar73._8_4_ = 0x7f800000;
                auVar73._0_8_ = 0x7f8000007f800000;
                auVar73._12_4_ = 0x7f800000;
                auVar73._16_4_ = 0x7f800000;
                auVar73._20_4_ = 0x7f800000;
                auVar73._24_4_ = 0x7f800000;
                auVar73._28_4_ = 0x7f800000;
                auVar66 = vblendvps_avx(auVar73,auVar115._0_32_,local_1580);
                auVar67 = vshufps_avx(auVar66,auVar66,0xb1);
                auVar67 = vminps_avx(auVar66,auVar67);
                auVar72 = vshufpd_avx(auVar67,auVar67,5);
                auVar67 = vminps_avx(auVar67,auVar72);
                auVar72 = vpermpd_avx2(auVar67,0x4e);
                auVar67 = vminps_avx(auVar67,auVar72);
                auVar66 = vcmpps_avx(auVar66,auVar67,0);
                auVar67 = local_1580 & auVar66;
                if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar67 >> 0x7f,0) != '\0') ||
                      (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar67 >> 0xbf,0) != '\0') ||
                    (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar67[0x1f] < '\0') {
                  auVar66 = vandps_avx(auVar66,local_1580);
                  auVar118 = ZEXT3264(auVar66);
                }
                goto LAB_00586ae7;
              }
            }
          }
LAB_00586f48:
          lVar34 = lVar34 + 1;
        } while (lVar34 != uVar35 - 8);
      }
      uVar146 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar62 = ZEXT1664(CONCAT412(uVar146,CONCAT48(uVar146,CONCAT44(uVar146,uVar146))));
      auVar118 = ZEXT1664(local_1370);
      auVar123 = ZEXT1664(local_1380);
      auVar133 = ZEXT1664(local_1390);
      auVar115 = ZEXT1664(local_1550);
      fVar134 = local_13a0;
      fVar137 = fStack_139c;
      fVar138 = fStack_1398;
      fVar139 = fStack_1394;
      fVar140 = local_13b0;
      fVar142 = fStack_13ac;
      fVar143 = fStack_13a8;
      fVar144 = fStack_13a4;
      fVar100 = local_13c0;
      fVar106 = fStack_13bc;
      fVar107 = fStack_13b8;
      fVar108 = fStack_13b4;
      fVar109 = local_13d0;
      fVar110 = fStack_13cc;
      fVar111 = fStack_13c8;
      fVar152 = fStack_13c4;
      fVar156 = local_13e0;
      fVar160 = fStack_13dc;
      fVar161 = fStack_13d8;
      fVar162 = fStack_13d4;
      fVar163 = local_13f0;
      fVar166 = fStack_13ec;
      fVar119 = fStack_13e8;
      fVar124 = fStack_13e4;
    }
    if (pauVar32 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }